

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.cc
# Opt level: O0

bool __thiscall
sptk::RealValuedFastFourierTransform::Run
          (RealValuedFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  bool bVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int iVar10;
  int iVar11;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  long in_R8;
  int i_2;
  double yt;
  double xt;
  int j_1;
  int i_1;
  double *cosp;
  double *sinp;
  double *yq;
  double *xq;
  double *yp;
  double *xp;
  double *y;
  double *x;
  FastFourierTransform *in_stack_00000078;
  int j;
  int i;
  int input_length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  size_type in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int iVar12;
  undefined4 in_stack_ffffffffffffff3c;
  int iVar13;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  double *pdVar14;
  double *local_b8;
  reference local_b0;
  reference local_a8;
  double *local_a0;
  double *local_98;
  int local_3c;
  int local_38;
  bool local_1;
  
  iVar10 = *(int *)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_RDI._M_current)[1]._M_current + 1;
  if ((((((ulong)((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_RDI._M_current)[9]._M_current & 1) == 0) ||
       (sVar6 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar6 != (long)iVar10))
      || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) ||
     ((in_RCX == (vector<double,_std::allocator<double>_> *)0x0 || (in_R8 == 0)))) {
    local_1 = false;
  }
  else {
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 8));
    if (sVar6 != (long)*(int *)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)in_RDI._M_current)[2]._M_current) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x20));
    if (sVar6 != (long)*(int *)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)in_RDI._M_current)[2]._M_current) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::capacity(in_RDX);
    if (sVar6 < (ulong)(long)*(int *)((long)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                               *)in_RDI._M_current)[1]._M_current + 4)) {
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::capacity(in_RCX);
    if (sVar6 < (ulong)(long)*(int *)((long)&((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                               *)in_RDI._M_current)[1]._M_current + 4)) {
      std::vector<double,_std::allocator<double>_>::reserve
                (in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    local_38 = 0;
    local_3c = 0;
    while (local_38 < iVar10) {
      iVar11 = local_38 + 1;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_38);
      in_stack_ffffffffffffff10 = (double *)*pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 8),(long)local_3c);
      *pvVar8 = (value_type)in_stack_ffffffffffffff10;
      if (iVar10 <= iVar11) break;
      local_38 = local_38 + 2;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar11);
      in_stack_ffffffffffffff08 = (vector<double,_std::allocator<double>_> *)*pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x20),(long)local_3c);
      *pvVar8 = (value_type)in_stack_ffffffffffffff08;
      local_3c = local_3c + 1;
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff08);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_RDI._M_current,(difference_type)in_stack_ffffffffffffff10);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff08);
    __first._M_current._4_4_ = in_stack_ffffffffffffff24;
    __first._M_current._0_4_ = in_stack_ffffffffffffff20;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first,in_RDI,in_stack_ffffffffffffff10);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff08);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_RDI._M_current,(difference_type)in_stack_ffffffffffffff10);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff08);
    __first_00._M_current._4_4_ = in_stack_ffffffffffffff24;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffff20;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first_00,in_RDI,in_stack_ffffffffffffff10);
    bVar5 = FastFourierTransform::Run
                      (in_stack_00000078,(vector<double,_std::allocator<double>_> *)x,
                       (vector<double,_std::allocator<double>_> *)y,
                       (vector<double,_std::allocator<double>_> *)xp,
                       (vector<double,_std::allocator<double>_> *)yp);
    if (bVar5) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
      iVar10 = *(int *)((long)in_RDI._M_current + 0xc);
      iVar11 = *(int *)((long)in_RDI._M_current + 0xc);
      pvVar8[*(int *)(in_RDI._M_current + 2)] = *pvVar8 - *pvVar9;
      *pvVar8 = *pvVar8 + *pvVar9;
      pvVar9[*(int *)(in_RDI._M_current + 2)] = 0.0;
      *pvVar9 = 0.0;
      local_b8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 10),0);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 10),0);
      pdVar14 = pvVar7 + *(int *)((long)in_RDI._M_current + 0xc) / 4;
      iVar12 = *(int *)(in_RDI._M_current + 2);
      local_b0 = pvVar9 + iVar11;
      local_a8 = pvVar8 + iVar10;
      local_a0 = pvVar9;
      local_98 = pvVar8;
      for (iVar13 = 1; iVar12 = iVar12 + -2, iVar13 < *(int *)(in_RDI._M_current + 2);
          iVar13 = iVar13 + 1) {
        local_98 = local_98 + 1;
        local_a0 = local_a0 + 1;
        local_b8 = local_b8 + 1;
        pdVar14 = pdVar14 + 1;
        dVar1 = *local_98;
        dVar2 = local_98[iVar12];
        dVar3 = *local_a0;
        dVar4 = local_a0[iVar12];
        local_a8[-1] = (-*local_b8 * (dVar1 - dVar2) +
                       *pdVar14 * (dVar3 + dVar4) + *local_98 + local_98[iVar12]) * 0.5;
        local_b0[-1] = (*pdVar14 * (dVar1 - dVar2) +
                       *local_b8 * (dVar3 + dVar4) + -*local_a0 + local_a0[iVar12]) * 0.5;
        local_b0 = local_b0 + -1;
        local_a8 = local_a8 + -1;
      }
      iVar10 = 1;
      local_b0 = pvVar9 + *(int *)((long)in_RDI._M_current + 0xc);
      local_a8 = pvVar8 + *(int *)((long)in_RDI._M_current + 0xc);
      local_a0 = pvVar9;
      local_98 = pvVar8;
      while( true ) {
        local_98 = local_98 + 1;
        local_a0 = local_a0 + 1;
        if (*(int *)(in_RDI._M_current + 2) <= iVar10) break;
        *local_98 = local_a8[-1];
        *local_a0 = -local_b0[-1];
        iVar10 = iVar10 + 1;
        local_b0 = local_b0 + -1;
        local_a8 = local_a8 + -1;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool RealValuedFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    RealValuedFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_order_ + 1);
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(input_length) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->real_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->real_part_input_.resize(half_fft_length_);
  }
  if (buffer->imag_part_input_.size() !=
      static_cast<std::size_t>(half_fft_length_)) {
    buffer->imag_part_input_.resize(half_fft_length_);
  }
  if (real_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    real_part_output->reserve(fft_length_);
  }
  if (imag_part_output->capacity() < static_cast<std::size_t>(fft_length_)) {
    imag_part_output->reserve(fft_length_);
  }

  // Copy input and fill zero.
  for (int i(0), j(0); i < input_length; ++j) {
    buffer->real_part_input_[j] = real_part_input[i++];
    if (input_length <= i) break;
    buffer->imag_part_input_[j] = real_part_input[i++];
  }
  std::fill(buffer->real_part_input_.begin() + (input_length + 1) / 2,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + input_length / 2,
            buffer->imag_part_input_.end(), 0.0);

  // Run fast Fourier transform.
  if (!fast_fourier_transform_.Run(buffer->real_part_input_,
                                   buffer->imag_part_input_, real_part_output,
                                   imag_part_output)) {
    return false;
  }
  real_part_output->resize(fft_length_);
  imag_part_output->resize(fft_length_);

  double* x(&((*real_part_output)[0]));
  double* y(&((*imag_part_output)[0]));
  double* xp(x);
  double* yp(y);
  double* xq(xp + fft_length_);
  double* yq(yp + fft_length_);
  *(xp + half_fft_length_) = *xp - *yp;
  *xp = *xp + *yp;
  *(yp + half_fft_length_) = 0.0;
  *yp = 0.0;

  const double* sinp(&(sine_table_[0]));
  const double* cosp(&(sine_table_[0]) + fft_length_ / 4);
  for (int i(1), j(half_fft_length_ - 2); i < half_fft_length_; ++i, j -= 2) {
    ++xp;
    ++yp;
    ++sinp;
    ++cosp;
    const double xt(*xp - *(xp + j));
    const double yt(*yp + *(yp + j));
    *(--xq) = (*xp + *(xp + j) + *cosp * yt - *sinp * xt) * 0.5;
    *(--yq) = (-*yp + *(yp + j) + *sinp * yt + *cosp * xt) * 0.5;
  }

  xp = x + 1;
  yp = y + 1;
  xq = x + fft_length_;
  yq = y + fft_length_;
  for (int i(1); i < half_fft_length_; ++i) {
    *xp++ = *(--xq);
    *yp++ = -(*(--yq));
  }

  return true;
}